

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Readable_String.h
# Opt level: O1

bool __thiscall
Jupiter::asBool<char>(Jupiter *this,basic_string_view<char,_std::char_traits<char>_> in_string)

{
  int iVar1;
  size_type __rlen;
  void *__s1;
  char *__s2;
  bool bVar2;
  
  __s1 = (void *)in_string._M_len;
  if (((this == (Jupiter *)0x5) &&
      ((iVar1 = bcmp(__s1,"FALSE",5), iVar1 == 0 || (iVar1 = bcmp(__s1,"false",5), iVar1 == 0)))) ||
     ((this == (Jupiter *)0x1 && (iVar1 = bcmp(__s1,"0",1), iVar1 == 0)))) {
LAB_0013910d:
    bVar2 = false;
  }
  else {
    if (this == (Jupiter *)0x3) {
      iVar1 = bcmp(__s1,"OFF",3);
      if (iVar1 == 0) goto LAB_0013910d;
      __s2 = "off";
    }
    else {
      if (this != (Jupiter *)0x1) {
        return true;
      }
      __s2 = "-";
    }
    iVar1 = bcmp(__s1,__s2,(size_t)this);
    bVar2 = iVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool asBool(std::basic_string_view<CharT> in_string) {
		using namespace std::literals;

		// Invert the logic here, so that we return true for numerics and "true"/"on"/"+", false otherwise
		// Note: temporarily removed case insensitivity, solely to avoid including unicode.hpp here
		if (in_string == "FALSE"sv
			|| in_string == "false"sv
			|| in_string == "0"sv
			|| in_string == "OFF"sv
			|| in_string == "off"sv
			|| in_string == "-"sv) {
			return false;
		}

		return true;
	}